

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O2

uint32_t __thiscall PatchNewGame::inject_func_init_game(PatchNewGame *this,ROM *rom,World *world)

{
  ushort from;
  uint32_t uVar1;
  int i;
  ulong uVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> flag_array;
  Code func_init_game;
  allocator<char> local_e1;
  string local_e0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  Code local_a8;
  
  build_flag_array((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,this,world);
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)local_c0._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_c0._M_impl.super__Vector_impl_data._M_start); uVar2 = uVar2 + 2) {
    from = *(ushort *)(local_c0._M_impl.super__Vector_impl_data._M_start + uVar2) << 8 |
           *(ushort *)(local_c0._M_impl.super__Vector_impl_data._M_start + uVar2) >> 8;
    if (from != 0) {
      local_e0._M_dataplus._M_p = (pointer)&PTR_getXn_00246ce8;
      local_e0._M_string_length = CONCAT44(2,(int)uVar2 + 0xff1000);
      md::Code::movew(&local_a8,from,(Param *)&local_e0);
    }
  }
  local_e0._M_dataplus._M_p = (pointer)&PTR_getXn_00246ce8;
  local_e0._M_string_length = 0x200ff1206;
  md::Code::movew(&local_a8,world->_spawn_map_id,(Param *)&local_e0);
  local_e0._M_dataplus._M_p = (pointer)&PTR_getXn_00246ce8;
  local_e0._M_string_length = 0x200ff5404;
  md::Code::moveb(&local_a8,world->_spawn_orientation,(Param *)&local_e0);
  local_e0._M_dataplus._M_p = (pointer)&PTR_getXn_00246ce8;
  local_e0._M_string_length = 0x200ff120e;
  md::Code::movew(&local_a8,world->_starting_golds,(Param *)&local_e0);
  md::Code::rts(&local_a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"",&local_e1);
  uVar1 = md::ROM::inject_code(rom,&local_a8,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  md::Code::~Code(&local_a8);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  return uVar1;
}

Assistant:

[[nodiscard]] uint32_t inject_func_init_game(md::ROM& rom, const World& world) const
    {
        std::vector<uint8_t> flag_array = build_flag_array(world);

        md::Code func_init_game;
        {
            // Init all flags with the contents of flag_array
            for(int i = 0 ; i < flag_array.size() ; i += 0x2)
            {
                uint16_t value = (static_cast<uint16_t>(flag_array[i]) << 8) + static_cast<uint16_t>(flag_array[i + 1]);
                if(value)
                    func_init_game.movew(value, addr_(0xFF1000 + i));
            }

            // Set the "parent map" value to the same value as "current map" so that dialogues work on spawn map
            func_init_game.movew(world.spawn_map_id(), addr_(0xFF1206));
            // Set the orientation byte of Nigel depending on spawn location on game start
            func_init_game.moveb(world.spawn_orientation(), addr_(0xFF5404));
            // Set the appropriate starting golds
            func_init_game.movew(world.starting_golds(), addr_(0xFF120E));
        }
        func_init_game.rts();

        return rom.inject_code(func_init_game);
    }